

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.cpp
# Opt level: O2

bool __thiscall hwnet::TCPListener::_start(TCPListener *this,OnNewConn *onNewConn,OnError *onError)

{
  Poller *this_00;
  int iVar1;
  socklen_t __len;
  int iVar2;
  Ptr local_50;
  long local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  iVar1 = socket((this->addr).family,1,6);
  this->fd = iVar1;
  if (-1 < iVar1) {
    SetNoBlock(iVar1,true);
    ReuseAddr(this->fd);
    iVar1 = this->fd;
    __len = Addr::AddrLen(&this->addr);
    iVar2 = bind(iVar1,(sockaddr *)&this->addr,__len);
    iVar1 = this->fd;
    if (iVar2 == 0) {
      iVar1 = listen(iVar1,0x1000);
      if (iVar1 == 0) {
        std::function<void_(const_std::shared_ptr<hwnet::TCPListener>_&,_int,_const_hwnet::Addr_&)>
        ::operator=(&this->onNewConn_,onNewConn);
        std::function<void_(const_std::shared_ptr<hwnet::TCPListener>_&,_int)>::operator=
                  (&this->onError_,onError);
        this_00 = this->poller_;
        std::__shared_ptr<hwnet::TCPListener,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<hwnet::TCPListener,void>
                  ((__shared_ptr<hwnet::TCPListener,(__gnu_cxx::_Lock_policy)2> *)&local_40,
                   (__weak_ptr<hwnet::TCPListener,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<hwnet::TCPListener>);
        local_50.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(local_40 + 8);
        if (local_40 == 0) {
          local_50.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
        }
        local_50.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             _Stack_38._M_pi;
        local_40 = 0;
        _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Poller::Add(this_00,&local_50,10);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_50.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38);
        return false;
      }
      iVar1 = this->fd;
    }
    close(iVar1);
    this->fd = -1;
  }
  return false;
}

Assistant:

bool TCPListener::_start(const OnNewConn &onNewConn,const OnError &onError) {
	this->fd = ::socket(this->addr.Family(),SOCK_STREAM,IPPROTO_TCP);
	
	if(this->fd < 0){
		return false;
	}

	SetNoBlock(this->fd,true);

	ReuseAddr(this->fd);

	if(0 != bind(this->fd,addr.Address(),addr.AddrLen())) {
        ::close(this->fd);
        this->fd = -1;
		return false;
	}
	
	if(0 != listen(this->fd,SOMAXCONN)) {
		::close(this->fd);
		this->fd = -1;
		return false;
	}

	this->onNewConn_ = onNewConn;
	this->onError_   = onError;
	this->poller_->Add(shared_from_this(),Poller::Read | Poller::ET);
	return false;
}